

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHalf.h
# Opt level: O0

uint16_t Ptex::v2_2::PtexHalf::fromFloat(float val)

{
  float in_XMM0_Da;
  int e;
  anon_union_4_2_947300a4 u;
  uint16_t local_2;
  
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    if (*(short *)(f2hTable + (ulong)((uint)in_XMM0_Da >> 0x17) * 2) == 0) {
      local_2 = fromFloat_except((uint32_t)in_XMM0_Da);
    }
    else {
      local_2 = *(short *)(f2hTable + (ulong)((uint)in_XMM0_Da >> 0x17) * 2) +
                (short)(((uint)in_XMM0_Da & 0x7fffff) + 0x1000 >> 0xd);
    }
  }
  else {
    local_2 = 0;
  }
  return local_2;
}

Assistant:

static uint16_t fromFloat(float val)
    {
        if (val==0) return 0;
        union { uint32_t i; float f; } u;
        u.f = val;
        int e = f2hTable[(u.i>>23)&0x1ff];
        if (e) return (uint16_t)(e + (((u.i&0x7fffff) + 0x1000) >> 13));
        return fromFloat_except(u.i);
    }